

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::sext(APInt *this,uint Width)

{
  bool bVar1;
  uint64_t *__dest;
  uint in_EDX;
  undefined8 extraout_RDX;
  ulong __n;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt *__src;
  byte bVar5;
  uint uVar6;
  APInt AVar7;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,Width);
  uVar4 = this_00->BitWidth;
  if (in_EDX <= uVar4) {
    __assert_fail("Width > BitWidth && \"Invalid APInt SignExtend request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x349,"APInt llvm::APInt::sext(unsigned int) const");
  }
  if (in_EDX < 0x41) {
    if ((ulong)uVar4 == 0) {
      __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    bVar5 = -(char)uVar4;
    APInt(this,in_EDX,(long)((this_00->U).VAL << (bVar5 & 0x3f)) >> (bVar5 & 0x3f),false);
    uVar2 = extraout_RDX;
  }
  else {
    __dest = (uint64_t *)operator_new__((ulong)((uint)((ulong)in_EDX + 0x3f >> 3) & 0xfffffff8));
    this->BitWidth = in_EDX;
    (this->U).pVal = __dest;
    __src = this_00;
    if (0x40 < uVar4) {
      __src = (APInt *)(this_00->U).pVal;
    }
    iVar3 = (int)((ulong)uVar4 + 0x3f >> 6);
    __n = (ulong)(uint)(iVar3 * 8);
    memcpy(__dest,__src,__n);
    uVar6 = iVar3 - 1;
    bVar5 = -(char)uVar4;
    __dest[uVar6] = (long)(__dest[uVar6] << (bVar5 & 0x3f)) >> (bVar5 & 0x3f);
    bVar1 = operator[](this_00,uVar4 - 1);
    iVar3 = (int)((ulong)in_EDX + 0x3f >> 6);
    memset((void *)(__n + (long)__dest),-(uint)bVar1,
           (ulong)(uint)((iVar3 - (int)((ulong)this_00->BitWidth + 0x3f >> 6)) * 8));
    uVar4 = iVar3 - 1;
    __dest[uVar4] = (__dest[uVar4] << (-(char)in_EDX & 0x3fU)) >> (-(char)in_EDX & 0x3fU);
    uVar2 = extraout_RDX_00;
  }
  AVar7._8_8_ = uVar2;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::sext(unsigned Width) const {
  assert(Width > BitWidth && "Invalid APInt SignExtend request");

  if (Width <= APINT_BITS_PER_WORD)
    return APInt(Width, SignExtend64(U.VAL, BitWidth));

  APInt Result(getMemory(getNumWords(Width)), Width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Sign extend the last word since there may be unused bits in the input.
  Result.U.pVal[getNumWords() - 1] =
      SignExtend64(Result.U.pVal[getNumWords() - 1],
                   ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

  // Fill with sign bits.
  std::memset(Result.U.pVal + getNumWords(), isNegative() ? -1 : 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);
  Result.clearUnusedBits();
  return Result;
}